

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall Variable_setGetInterfaceType_Test::TestBody(Variable_setGetInterfaceType_Test *this)

{
  char *pcVar1;
  AssertHelper local_100 [8];
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  VariablePtr v4;
  VariablePtr v3;
  VariablePtr v2;
  VariablePtr v1;
  string interfaceTypeString4;
  string interfaceTypeString3;
  string interfaceTypeString2;
  string interfaceTypeString1;
  
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Variable::setInterfaceType
            ((InterfaceType)
             v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::setInterfaceType
            ((InterfaceType)
             v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::setInterfaceType
            ((InterfaceType)
             v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::Variable::setInterfaceType
            ((InterfaceType)
             v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&interfaceTypeString1,"none",(allocator<char> *)&interfaceTypeString2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&interfaceTypeString2,"private",(allocator<char> *)&interfaceTypeString3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&interfaceTypeString3,"public",(allocator<char> *)&interfaceTypeString4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&interfaceTypeString4,"public_and_private",(allocator<char> *)&local_e8);
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"interfaceTypeString1","v1->interfaceType()",
             &interfaceTypeString1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1aa,pcVar1);
    testing::internal::AssertHelper::operator=(local_100,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"interfaceTypeString2","v2->interfaceType()",
             &interfaceTypeString2,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1ab,pcVar1);
    testing::internal::AssertHelper::operator=(local_100,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"interfaceTypeString3","v3->interfaceType()",
             &interfaceTypeString3,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1ac,pcVar1);
    testing::internal::AssertHelper::operator=(local_100,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Variable::interfaceType_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"interfaceTypeString4","v4->interfaceType()",
             &interfaceTypeString4,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_100,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x1ad,pcVar1);
    testing::internal::AssertHelper::operator=(local_100,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_100);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&interfaceTypeString4);
  std::__cxx11::string::~string((string *)&interfaceTypeString3);
  std::__cxx11::string::~string((string *)&interfaceTypeString2);
  std::__cxx11::string::~string((string *)&interfaceTypeString1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v4.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v3.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v2.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&v1.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Variable, setGetInterfaceType)
{
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();
    libcellml::VariablePtr v4 = libcellml::Variable::create();
    libcellml::Variable::InterfaceType interfaceType1 = libcellml::Variable::InterfaceType::NONE;
    libcellml::Variable::InterfaceType interfaceType2 = libcellml::Variable::InterfaceType::PRIVATE;
    libcellml::Variable::InterfaceType interfaceType3 = libcellml::Variable::InterfaceType::PUBLIC;
    libcellml::Variable::InterfaceType interfaceType4 = libcellml::Variable::InterfaceType::PUBLIC_AND_PRIVATE;
    v1->setInterfaceType(interfaceType1);
    v2->setInterfaceType(interfaceType2);
    v3->setInterfaceType(interfaceType3);
    v4->setInterfaceType(interfaceType4);

    const std::string interfaceTypeString1 = "none";
    const std::string interfaceTypeString2 = "private";
    const std::string interfaceTypeString3 = "public";
    const std::string interfaceTypeString4 = "public_and_private";

    EXPECT_EQ(interfaceTypeString1, v1->interfaceType());
    EXPECT_EQ(interfaceTypeString2, v2->interfaceType());
    EXPECT_EQ(interfaceTypeString3, v3->interfaceType());
    EXPECT_EQ(interfaceTypeString4, v4->interfaceType());
}